

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O1

SmallHeapBlockBitVector * __thiscall
Memory::SmallHeapBlockT<MediumAllocationBlockAttributes>::EnsureFreeBitVector
          (SmallHeapBlockT<MediumAllocationBlockAttributes> *this,bool isCollecting)

{
  ushort uVar1;
  
  if (this->freeObjectList == this->lastFreeObjectHead) {
    CheckFreeBitVector(this,isCollecting);
  }
  else {
    uVar1 = BuildFreeBitVector(this,&this->freeBits);
    this->freeCount = uVar1;
    this->lastFreeObjectHead = this->freeObjectList;
  }
  return &this->freeBits;
}

Assistant:

typename SmallHeapBlockT<TBlockAttributes>::SmallHeapBlockBitVector *
SmallHeapBlockT<TBlockAttributes>::EnsureFreeBitVector(bool isCollecting)
{
    if (this->IsFreeBitsValid())
    {
        // the free object list hasn't change, so the free vector should be valid
        RECYCLER_SLOW_CHECK(CheckFreeBitVector(isCollecting));
        return this->GetFreeBitVector();
    }
    return BuildFreeBitVector();
}